

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O1

X509_LOOKUP * X509_STORE_add_lookup(X509_STORE *v,X509_LOOKUP_METHOD *m)

{
  OPENSSL_STACK *sk;
  int iVar1;
  size_t sVar2;
  X509_LOOKUP *pXVar3;
  ulong i;
  X509_LOOKUP *unaff_R14;
  bool bVar4;
  
  sk = (OPENSSL_STACK *)v->check_revocation;
  sVar2 = OPENSSL_sk_num(sk);
  bVar4 = sVar2 != 0;
  if ((bVar4) &&
     (pXVar3 = (X509_LOOKUP *)OPENSSL_sk_value(sk,0), unaff_R14 = pXVar3,
     *(X509_LOOKUP_METHOD **)pXVar3 != m)) {
    i = 1;
    do {
      sVar2 = OPENSSL_sk_num(sk);
      bVar4 = i < sVar2;
      unaff_R14 = pXVar3;
      if (!bVar4) break;
      unaff_R14 = (X509_LOOKUP *)OPENSSL_sk_value(sk,i);
      i = i + 1;
    } while (*(X509_LOOKUP_METHOD **)unaff_R14 != m);
  }
  if (bVar4) {
    return unaff_R14;
  }
  pXVar3 = (X509_LOOKUP *)OPENSSL_zalloc(0x18);
  if (pXVar3 != (X509_LOOKUP *)0x0) {
    *(X509_LOOKUP_METHOD **)pXVar3 = m;
    pXVar3->method_data = (char *)v;
    if (((code *)m->name == (code *)0x0) || (iVar1 = (*(code *)m->name)(pXVar3), iVar1 != 0))
    goto LAB_0019c69e;
    OPENSSL_free(pXVar3);
  }
  pXVar3 = (X509_LOOKUP *)0x0;
LAB_0019c69e:
  if ((pXVar3 == (X509_LOOKUP *)0x0) ||
     (sVar2 = OPENSSL_sk_push((OPENSSL_STACK *)v->check_revocation,pXVar3), sVar2 == 0)) {
    X509_LOOKUP_free(pXVar3);
    pXVar3 = (X509_LOOKUP *)0x0;
  }
  return pXVar3;
}

Assistant:

X509_LOOKUP *X509_STORE_add_lookup(X509_STORE *v, const X509_LOOKUP_METHOD *m) {
  STACK_OF(X509_LOOKUP) *sk = v->get_cert_methods;
  for (size_t i = 0; i < sk_X509_LOOKUP_num(sk); i++) {
    X509_LOOKUP *lu = sk_X509_LOOKUP_value(sk, i);
    if (m == lu->method) {
      return lu;
    }
  }

  X509_LOOKUP *lu = X509_LOOKUP_new(m, v);
  if (lu == NULL || !sk_X509_LOOKUP_push(v->get_cert_methods, lu)) {
    X509_LOOKUP_free(lu);
    return NULL;
  }

  return lu;
}